

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputWriteByte
          (SMBusSimulationDataGenerator *this,U8 command,U8 data_byte)

{
  U8 byte;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  U8 pec;
  U8 data_byte_local;
  U8 command_local;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar1 = OutputAddr(this,'C',false,true);
  bVar1 = ""[(int)(uint)bVar1];
  bVar2 = OutputByte(this,command,true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  bVar2 = OutputByte(this,data_byte,bVar3);
  byte = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar3) {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputWriteByte( U8 command, U8 data_byte )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( data_byte, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}